

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

size_t __thiscall SimpleString::getPrintableSize(SimpleString *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t i;
  size_t sVar3;
  
  sVar1 = size(this);
  sVar2 = sVar1;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    if ((byte)(this->buffer_[sVar3] - 7U) < 7) {
      sVar2 = sVar2 + 1;
    }
    else if ((byte)(this->buffer_[sVar3] + 0x81U) < 0xa1) {
      sVar2 = sVar2 + 3;
    }
  }
  return sVar2;
}

Assistant:

size_t SimpleString::getPrintableSize() const
{
    size_t str_size = size();
    size_t printable_str_size = str_size;

    for (size_t i = 0; i < str_size; i++)
    {
        char c = buffer_[i];
        if (isControlWithShortEscapeSequence(c))
        {
            printable_str_size += 1;
        }
        else if (isControl(c))
        {
            printable_str_size += 3;
        }
    }

    return printable_str_size;
}